

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPutOnTop(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"ch");
  } while (iVar1 == 99);
  if (iVar1 == -1) {
    if (globalUtilOptind + 1 == argc) {
      if (pAVar2->ntkType == ABC_NTK_LOGIC) {
        if (pAVar2->nObjCounts[8] == 0) {
          pcVar3 = argv[globalUtilOptind];
          FileType = Io_ReadFileType(pcVar3);
          pNtk = Io_Read(pcVar3,FileType,1,0);
          if (pNtk == (Abc_Ntk_t *)0x0) {
            return 1;
          }
          if (pNtk->nObjCounts[8] == 0) {
            if (pAVar2->vPos->nSize == pNtk->vPis->nSize) {
              pAVar2 = Abc_NtkPutOnTop(pAVar2,pNtk);
              Abc_NtkDelete(pNtk);
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              return 0;
            }
            Abc_NtkDelete(pNtk);
            Abc_Print(-1,
                      "The PO count (%d) of the first network is not equal to PI count (%d) of the second network.\n"
                      ,(ulong)(uint)pAVar2->vPos->nSize,(ulong)(uint)pNtk->vPis->nSize);
            return 0;
          }
          Abc_NtkDelete(pNtk);
          pcVar3 = "The second network has latches. This command does not work for such networks.\n"
          ;
        }
        else {
          pcVar3 = 
          "The current network has latches. This command does not work for such networks.\n";
        }
        Abc_Print(-1,pcVar3);
        return 0;
      }
      pcVar3 = "The base network should be in the logic form.\n";
    }
    else {
      pcVar3 = "The network to append is not given.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: putontop [-h] <file>\n");
    Abc_Print(-2,"\t         connects PIs of network in <file> to POs of current network\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar3 = "\t<file> : file name with the second network\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandPutOnTop( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkPutOnTop( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtk2 );

    Abc_Ntk_t * pNtk, * pNtk2, * pNtkRes;
    char * FileName;
    int fComb = 0;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fComb ^= 1;
            break;
        default:
            goto usage;
        }
    }

    // get the second network
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "The network to append is not given.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The base network should be in the logic form.\n" );
        return 1;
    }

    // check if the second network is combinational
    if ( Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The current network has latches. This command does not work for such networks.\n" );
        return 0;
    }

    // read the second network
    FileName = argv[globalUtilOptind];
    pNtk2 = Io_Read( FileName, Io_ReadFileType(FileName), 1, 0 );
    if ( pNtk2 == NULL )
        return 1;

    // check if the second network is combinational
    if ( Abc_NtkLatchNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The second network has latches. This command does not work for such networks.\n" );
        return 0;
    }
    // compare inputs/outputs
    if ( Abc_NtkPoNum(pNtk) != Abc_NtkPiNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The PO count (%d) of the first network is not equal to PI count (%d) of the second network.\n", Abc_NtkPoNum(pNtk), Abc_NtkPiNum(pNtk2) );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkPutOnTop( pNtk, pNtk2 );
    Abc_NtkDelete( pNtk2 );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: putontop [-h] <file>\n" );
    Abc_Print( -2, "\t         connects PIs of network in <file> to POs of current network\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with the second network\n");
    return 1;
}